

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

void internal_search(Am_Object *cmd,Am_Which_Search_Direction dir)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value;
  undefined1 local_e8 [8];
  Am_Value_List old_sel_list;
  Am_Assoc local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Value local_b0;
  Am_Object local_a0;
  Am_Value local_98;
  undefined1 local_88 [8];
  Am_Value_List slots_and_values_used;
  Am_Value v;
  Am_Object item;
  Am_Am_Slot_Key key;
  Am_Assoc as;
  Am_Value_List slots_to_item;
  Am_Object sel_widget;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object search_widget;
  Am_Which_Search_Direction dir_local;
  Am_Object *cmd_local;
  
  search_widget.data._4_4_ = dir;
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)&local_28);
  Am_Object::~Am_Object(&local_28);
  pAVar3 = Am_Object::Get(&local_20,0x197,0);
  Am_Object::Am_Object((Am_Object *)&slots_to_item.item,pAVar3);
  pAVar3 = Am_Object::Get(&local_20,Am_SLOTS_TO_ITEMS,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&as,pAVar3);
  Am_Assoc::Am_Assoc((Am_Assoc *)&stack0xffffffffffffffa8);
  Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)((long)&item.data + 6),0);
  Am_Object::Am_Object((Am_Object *)&v.value);
  Am_Value::Am_Value((Am_Value *)&slots_and_values_used.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_88);
  Am_Value_List::Start((Am_Value_List *)&as);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)&as), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar3 = Am_Value_List::Get((Am_Value_List *)&as);
    Am_Assoc::operator=((Am_Assoc *)&stack0xffffffffffffffa8,pAVar3);
    Am_Assoc::Value_2((Am_Assoc *)&local_98);
    Am_Object::operator=((Am_Object *)&v.value,&local_98);
    Am_Value::~Am_Value(&local_98);
    Am_Object::Get_Object(&local_a0,(short)&v + 8,(ulong)Am_USE_ITEM);
    pAVar3 = Am_Object::Get(&local_a0,0x169,0);
    bVar1 = Am_Value::Valid(pAVar3);
    Am_Object::~Am_Object(&local_a0);
    if (bVar1) {
      Am_Assoc::Value_1((Am_Assoc *)&local_b0);
      Am_Am_Slot_Key::operator=((Am_Am_Slot_Key *)((long)&item.data + 6),&local_b0);
      Am_Value::~Am_Value(&local_b0);
      AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                        ((Am_Am_Slot_Key *)((long)&item.data + 6));
      if (AVar2 == 0xb) {
        Am_Object::Get_Object(&local_b8,(short)&v + 8,(ulong)Am_ITEM_VALUE);
        pAVar3 = Am_Object::Get(&local_b8,0x169,0);
        Am_Value::operator=((Am_Value *)&slots_and_values_used.item,pAVar3);
        Am_Object::~Am_Object(&local_b8);
      }
      else {
        Am_Object::Get_Object(&local_c0,(short)&v + 8,(ulong)Am_ITEM_VALUE);
        pAVar3 = Am_Object::Get(&local_c0,0xfa,0);
        Am_Value::operator=((Am_Value *)&slots_and_values_used.item,pAVar3);
        Am_Object::~Am_Object(&local_c0);
      }
      Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&old_sel_list.item);
      Am_Assoc::Am_Assoc(&local_c8,(Am_Value *)&old_sel_list.item,
                         (Am_Value *)&slots_and_values_used.item);
      value = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_c8);
      Am_Value_List::Add((Am_Value_List *)local_88,value,Am_TAIL,true);
      Am_Assoc::~Am_Assoc(&local_c8);
      Am_Value::~Am_Value((Am_Value *)&old_sel_list.item);
    }
    Am_Value_List::Next((Am_Value_List *)&as);
  }
  pAVar3 = Am_Object::Get((Am_Object *)&slots_to_item.item,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_e8,pAVar3);
  internal_search_using
            (cmd,search_widget.data._4_4_,(Am_Object *)&slots_to_item.item,(Am_Value_List *)local_e8
             ,(Am_Value_List *)local_88);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_e8);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_88);
  Am_Value::~Am_Value((Am_Value *)&slots_and_values_used.item);
  Am_Object::~Am_Object((Am_Object *)&v.value);
  Am_Assoc::~Am_Assoc((Am_Assoc *)&stack0xffffffffffffffa8);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&as);
  Am_Object::~Am_Object((Am_Object *)&slots_to_item.item);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
internal_search(Am_Object &cmd, Am_Which_Search_Direction dir)
{
  Am_Object search_widget = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List slots_to_item = search_widget.Get(Am_SLOTS_TO_ITEMS);

  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Object item;
  Am_Value v;
  Am_Value_List slots_and_values_used;
  for (slots_to_item.Start(); !slots_to_item.Last(); slots_to_item.Next()) {
    as = slots_to_item.Get();
    item = as.Value_2();
    if (item.Get_Object(Am_USE_ITEM).Get(Am_VALUE).Valid()) {
      key = as.Value_1();
      if ((Am_Slot_Key)key == Am_PROTOTYPE)
        v = item.Get_Object(Am_ITEM_VALUE).Get(Am_VALUE);
      else
        v = item.Get_Object(Am_ITEM_VALUE).Get(Am_VALUES);
      slots_and_values_used.Add(Am_Assoc(key, v));
    }
  }
  Am_Value_List old_sel_list = sel_widget.Get(Am_VALUE);
  internal_search_using(cmd, dir, sel_widget, old_sel_list,
                        slots_and_values_used);
}